

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

void vocinialo(voccxdef *ctx,vocddef **what,int cnt)

{
  errdef *peVar1;
  int in_EDX;
  errcxdef *in_RSI;
  vocddef *p;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  peVar1 = (errdef *)
           mchalo(in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0);
  in_RSI->errcxptr = peVar1;
  peVar1 = in_RSI->errcxptr;
  for (; in_EDX != 0; in_EDX = in_EDX + -1) {
    *(undefined2 *)&peVar1->errprv = 0xffff;
    peVar1 = (errdef *)(peVar1->erraav + 1);
  }
  return;
}

Assistant:

void vocinialo(voccxdef *ctx, vocddef **what, int cnt)
{
    vocddef *p;
    
    *what = (vocddef *)mchalo(ctx->voccxerr,
                              (cnt * sizeof(vocddef)), "vocinialo");

    /* set all object/function entries to MCMONINV to indicate not-in-use */
    for (p = *what ; cnt ; ++p, --cnt)
        p->vocdfn = MCMONINV;
}